

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O2

LY_ERR yin_parse_restriction(lysp_yin_ctx *ctx,ly_stmt restr_kw,lysp_restr *restr)

{
  LY_ERR LVar1;
  yin_subelement subelems [5];
  
  subelems[0].type = LY_STMT_DESCRIPTION;
  subelems[0].dest = &restr->dsc;
  subelems[0].flags = 2;
  subelems[1].type = LY_STMT_ERROR_APP_TAG;
  subelems[1].dest = &restr->eapptag;
  subelems[1].flags = 2;
  subelems[2].type = LY_STMT_ERROR_MESSAGE;
  subelems[2].dest = &restr->emsg;
  subelems[2].flags = 2;
  subelems[3].type = LY_STMT_REFERENCE;
  subelems[3].dest = &restr->ref;
  subelems[3].flags = 2;
  subelems[4].dest = (void *)0x0;
  subelems[4].flags = 0;
  subelems[4]._18_6_ = 0;
  subelems[4].type = LY_STMT_EXTENSION_INSTANCE;
  subelems[4]._4_4_ = 0;
  if (((restr_kw != LY_STMT_LENGTH) && (restr_kw != LY_STMT_MUST)) && (restr_kw != LY_STMT_RANGE)) {
    __assert_fail("restr_kw == LY_STMT_MUST || restr_kw == LY_STMT_LENGTH || restr_kw == LY_STMT_RANGE"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0x3f1,
                  "LY_ERR yin_parse_restriction(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_restr *)"
                 );
  }
  LVar1 = lyxml_ctx_next(ctx->xmlctx);
  if (LVar1 == LY_SUCCESS) {
    LVar1 = yin_parse_attribute(ctx,(uint)(restr_kw == LY_STMT_MUST) * 2 + YIN_ARG_VALUE,
                                (char **)restr,Y_STR_ARG,restr_kw);
    if (LVar1 == LY_SUCCESS) {
      (restr->arg).mod =
           (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      LVar1 = yin_parse_content(ctx,subelems,5,restr,restr_kw,(char **)0x0,&restr->exts);
      if (LVar1 == LY_SUCCESS) {
        LVar1 = yin_unres_exts_add(ctx,restr->exts);
      }
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
yin_parse_restriction(struct lysp_yin_ctx *ctx, enum ly_stmt restr_kw, struct lysp_restr *restr)
{
    struct yin_subelement subelems[] = {
        {LY_STMT_DESCRIPTION, &restr->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_ERROR_APP_TAG, &restr->eapptag, YIN_SUBELEM_UNIQUE},
        {LY_STMT_ERROR_MESSAGE, &restr->emsg, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFERENCE, &restr->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };
    /* argument of must is called condition, but argument of length and range is called value */
    enum yin_argument arg_type = (restr_kw == LY_STMT_MUST) ? YIN_ARG_CONDITION : YIN_ARG_VALUE;

    assert(restr_kw == LY_STMT_MUST || restr_kw == LY_STMT_LENGTH || restr_kw == LY_STMT_RANGE);

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, arg_type, &restr->arg.str, Y_STR_ARG, restr_kw));
    restr->arg.mod = PARSER_CUR_PMOD(ctx);

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), restr, restr_kw, NULL, &restr->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, restr->exts));

    return LY_SUCCESS;
}